

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cStencilTexturingTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::StencilTexturing::FunctionalTest::prepareProgram
          (FunctionalTest *this,bool is_draw,bool is_stencil)

{
  Context *pCVar1;
  undefined *__s;
  GLchar *pGVar2;
  GLchar *gs_code;
  GLchar *tcs_code;
  GLchar *tes_code;
  GLchar *vs_code;
  string *local_1f8;
  string *local_1a0;
  size_t local_170;
  size_t position_1;
  GLchar *pGStack_160;
  GLuint i;
  GLchar *type_1;
  GLchar *shader_templates [5];
  undefined1 local_128 [8];
  string shader_code [5];
  GLchar *local_80;
  GLchar *sampler_definition_1;
  GLchar *expected_value;
  GLchar *type;
  GLchar *sampler_definition;
  size_t position;
  GLchar *image_definition;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string cs_code;
  GLuint program_id;
  bool is_stencil_local;
  bool is_draw_local;
  FunctionalTest *this_local;
  
  __s = m_compute_shader_code;
  cs_code.field_2._8_4_ = 0;
  cs_code.field_2._M_local_buf[0xe] = is_stencil;
  cs_code.field_2._M_local_buf[0xf] = is_draw;
  if (is_draw) {
    sampler_definition_1 = m_expected_value_stencil;
    local_80 = m_sampler_definition_stencil;
    local_1a0 = (string *)local_128;
    do {
      std::__cxx11::string::string(local_1a0);
      local_1a0 = local_1a0 + 0x20;
    } while (local_1a0 != (string *)((long)&shader_code[4].field_2 + 8));
    type_1 = m_fragment_shader_code;
    shader_templates[0] = m_geometry_shader_code;
    shader_templates[1] = m_tesselation_control_shader_code;
    shader_templates[2] = m_tesselation_evaluation_shader_code;
    shader_templates[3] = m_vertex_shader_code;
    pGStack_160 = m_output_type_stencil;
    if ((cs_code.field_2._M_local_buf[0xe] & 1U) == 0) {
      sampler_definition_1 = m_expected_value_depth;
      local_80 = m_sampler_definition_depth;
      pGStack_160 = m_output_type_depth;
    }
    for (position_1._4_4_ = 0; position_1._4_4_ < 5; position_1._4_4_ = position_1._4_4_ + 1) {
      local_170 = 0;
      std::__cxx11::string::operator=
                ((string *)(shader_code[(ulong)position_1._4_4_ - 1].field_2._M_local_buf + 8),
                 shader_templates[(ulong)position_1._4_4_ - 1]);
      if (position_1._4_4_ == 0) {
        Utils::replaceToken("TYPE",&local_170,pGStack_160,(string *)local_128);
        Utils::replaceToken("SAMPLER_DEFINITION",&local_170,local_80,
                            (string *)((long)&shader_code[(ulong)position_1._4_4_ - 1].field_2 + 8))
        ;
      }
      else {
        Utils::replaceToken("SAMPLER_DEFINITION",&local_170,local_80,
                            (string *)((long)&shader_code[(ulong)position_1._4_4_ - 1].field_2 + 8))
        ;
        Utils::replaceToken("EXPECTED_VALUE",&local_170,sampler_definition_1,
                            (string *)((long)&shader_code[(ulong)position_1._4_4_ - 1].field_2 + 8))
        ;
      }
    }
    pCVar1 = (this->super_TestCase).m_context;
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    gs_code = (GLchar *)std::__cxx11::string::c_str();
    tcs_code = (GLchar *)std::__cxx11::string::c_str();
    tes_code = (GLchar *)std::__cxx11::string::c_str();
    vs_code = (GLchar *)std::__cxx11::string::c_str();
    cs_code.field_2._8_4_ =
         Utils::createAndBuildProgram(pCVar1,(GLchar *)0x0,pGVar2,gs_code,tcs_code,tes_code,vs_code)
    ;
    local_1f8 = (string *)(shader_code[4].field_2._M_local_buf + 8);
    do {
      local_1f8 = local_1f8 + -0x20;
      std::__cxx11::string::~string(local_1f8);
    } while (local_1f8 != (string *)local_128);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_38,__s,&local_39);
    std::allocator<char>::~allocator(&local_39);
    position = (size_t)m_image_definition_stencil;
    sampler_definition = (GLchar *)0x0;
    type = m_sampler_definition_stencil;
    expected_value = m_output_type_stencil;
    if ((cs_code.field_2._M_local_buf[0xe] & 1U) == 0) {
      position = (size_t)m_image_definition_depth;
      type = m_sampler_definition_depth;
      expected_value = m_output_type_depth;
    }
    Utils::replaceToken("IMAGE_DEFINITION",(size_t *)&sampler_definition,(GLchar *)position,
                        (string *)local_38);
    Utils::replaceToken("SAMPLER_DEFINITION",(size_t *)&sampler_definition,type,(string *)local_38);
    Utils::replaceToken("TYPE",(size_t *)&sampler_definition,expected_value,(string *)local_38);
    pCVar1 = (this->super_TestCase).m_context;
    pGVar2 = (GLchar *)std::__cxx11::string::c_str();
    cs_code.field_2._8_4_ =
         Utils::createAndBuildProgram
                   (pCVar1,pGVar2,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
                    (GLchar *)0x0);
    std::__cxx11::string::~string((string *)local_38);
  }
  return cs_code.field_2._8_4_;
}

Assistant:

GLuint FunctionalTest::prepareProgram(bool is_draw, bool is_stencil)
{
	GLuint program_id = 0;

	if (true != is_draw)
	{
		std::string   cs_code			 = m_compute_shader_code;
		const GLchar* image_definition   = m_image_definition_stencil;
		size_t		  position			 = 0;
		const GLchar* sampler_definition = m_sampler_definition_stencil;
		const GLchar* type				 = m_output_type_stencil;

		if (false == is_stencil)
		{
			image_definition   = m_image_definition_depth;
			sampler_definition = m_sampler_definition_depth;
			type			   = m_output_type_depth;
		}

		Utils::replaceToken("IMAGE_DEFINITION", position, image_definition, cs_code);
		Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, cs_code);
		Utils::replaceToken("TYPE", position, type, cs_code);

		program_id = Utils::createAndBuildProgram(m_context, cs_code.c_str(), 0 /* fs_code */, 0 /* gs_code */,
												  0 /* tcs_code */, 0 /* tes_code */, 0 /* vs_code */);
	}
	else
	{
#define N_FUNCTIONAL_TEST_SHADER_STAGES 5

		const GLchar* expected_value	 = m_expected_value_stencil;
		const GLchar* sampler_definition = m_sampler_definition_stencil;
		std::string   shader_code[N_FUNCTIONAL_TEST_SHADER_STAGES];
		const GLchar* shader_templates[N_FUNCTIONAL_TEST_SHADER_STAGES] = {
			m_fragment_shader_code, m_geometry_shader_code, m_tesselation_control_shader_code,
			m_tesselation_evaluation_shader_code, m_vertex_shader_code
		};
		const GLchar* type = m_output_type_stencil;

		if (false == is_stencil)
		{
			expected_value	 = m_expected_value_depth;
			sampler_definition = m_sampler_definition_depth;
			type			   = m_output_type_depth;
		}

		for (GLuint i = 0; i < N_FUNCTIONAL_TEST_SHADER_STAGES; ++i)
		{
			size_t position = 0;

			shader_code[i] = shader_templates[i];

			if (0 == i)
			{
				Utils::replaceToken("TYPE", position, type, shader_code[i]);
				Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, shader_code[i]);
				//Utils::replaceToken("TYPE",               position, type,               shader_code[i]);
			}
			else
			{
				Utils::replaceToken("SAMPLER_DEFINITION", position, sampler_definition, shader_code[i]);
				Utils::replaceToken("EXPECTED_VALUE", position, expected_value, shader_code[i]);
			}
		}

		program_id =
			Utils::createAndBuildProgram(m_context, 0 /* cs_code */, shader_code[0].c_str() /* fs_code  */,
										 shader_code[1].c_str() /* gs_code  */, shader_code[2].c_str() /* tcs_code */,
										 shader_code[3].c_str() /* tes_code */, shader_code[4].c_str() /* vs_code  */);
	}

	/* Done */
	return program_id;
}